

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::initViewItemOption(QListView *this,QStyleOptionViewItem *option)

{
  long lVar1;
  bool bVar2;
  QListViewPrivate *this_00;
  QStyle *pQVar3;
  long in_RSI;
  QSize *in_RDI;
  long in_FS_OFFSET;
  int pm;
  QListViewPrivate *d;
  int in_stack_ffffffffffffff98;
  AlignmentFlag in_stack_ffffffffffffff9c;
  QListViewPrivate *in_stack_ffffffffffffffa0;
  undefined4 local_54;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 local_14;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QListView *)0x87a41f);
  QAbstractItemView::initViewItemOption
            ((QAbstractItemView *)this_00,
             (QStyleOptionViewItem *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  bVar2 = QSize::isValid(in_RDI);
  if (!bVar2) {
    if (this_00->viewMode == ListMode) {
      pQVar3 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      local_54 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x3c,0,in_RDI);
    }
    else {
      pQVar3 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      local_54 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x3d,0,in_RDI);
    }
    QSize::QSize((QSize *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                 in_stack_ffffffffffffff98);
    *(undefined8 *)(in_RSI + 0x50) = local_10;
    in_stack_ffffffffffffffbc = local_54;
  }
  if (this_00->viewMode == IconMode) {
    *(undefined1 *)(in_RSI + 0x68) = 0;
    *(undefined4 *)(in_RSI + 0x4c) = 2;
    QFlags<Qt::AlignmentFlag>::QFlags
              ((QFlags<Qt::AlignmentFlag> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    *(undefined4 *)(in_RSI + 0x40) = local_14;
  }
  else {
    *(undefined4 *)(in_RSI + 0x4c) = 0;
  }
  QListViewPrivate::gridSize(in_stack_ffffffffffffffa0);
  bVar2 = QSize::isValid(in_RDI);
  if (bVar2) {
    QListViewPrivate::gridSize((QListViewPrivate *)(in_RSI + 0x10));
    QRect::setSize((QRect *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::initViewItemOption(QStyleOptionViewItem *option) const
{
    Q_D(const QListView);
    QAbstractItemView::initViewItemOption(option);
    if (!d->iconSize.isValid()) { // otherwise it was already set in abstractitemview
        int pm = (d->viewMode == QListView::ListMode
                  ? style()->pixelMetric(QStyle::PM_ListViewIconSize, nullptr, this)
                  : style()->pixelMetric(QStyle::PM_IconViewIconSize, nullptr, this));
        option->decorationSize = QSize(pm, pm);
    }
    if (d->viewMode == QListView::IconMode) {
        option->showDecorationSelected = false;
        option->decorationPosition = QStyleOptionViewItem::Top;
        option->displayAlignment = Qt::AlignCenter;
    } else {
        option->decorationPosition = QStyleOptionViewItem::Left;
    }

    if (d->gridSize().isValid()) {
        option->rect.setSize(d->gridSize());
    }
}